

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclosure.h
# Opt level: O3

void __thiscall SQClosure::Finalize(SQClosure *this)

{
  long *plVar1;
  uint uVar2;
  SQFunctionProto *pSVar3;
  SQObjectPtr *pSVar4;
  long *plVar5;
  long lVar6;
  long lVar7;
  
  pSVar3 = this->_function;
  if (0 < pSVar3->_noutervalues) {
    lVar7 = 8;
    lVar6 = 0;
    do {
      pSVar4 = this->_outervalues;
      plVar5 = *(long **)((long)&(pSVar4->super_SQObject)._type + lVar7);
      uVar2 = *(uint *)((long)pSVar4 + lVar7 + -8);
      *(undefined4 *)((long)pSVar4 + lVar7 + -8) = 0x1000001;
      *(undefined8 *)((long)&(pSVar4->super_SQObject)._type + lVar7) = 0;
      if ((uVar2 >> 0x1b & 1) != 0) {
        plVar1 = plVar5 + 1;
        *plVar1 = *plVar1 + -1;
        if (*plVar1 == 0) {
          (**(code **)(*plVar5 + 0x10))();
        }
      }
      lVar6 = lVar6 + 1;
      lVar7 = lVar7 + 0x10;
    } while (lVar6 < pSVar3->_noutervalues);
  }
  if (0 < pSVar3->_ndefaultparams) {
    lVar7 = 8;
    lVar6 = 0;
    do {
      pSVar4 = this->_defaultparams;
      plVar5 = *(long **)((long)&(pSVar4->super_SQObject)._type + lVar7);
      uVar2 = *(uint *)((long)pSVar4 + lVar7 + -8);
      *(undefined4 *)((long)pSVar4 + lVar7 + -8) = 0x1000001;
      *(undefined8 *)((long)&(pSVar4->super_SQObject)._type + lVar7) = 0;
      if ((uVar2 >> 0x1b & 1) != 0) {
        plVar1 = plVar5 + 1;
        *plVar1 = *plVar1 + -1;
        if (*plVar1 == 0) {
          (**(code **)(*plVar5 + 0x10))();
        }
      }
      lVar6 = lVar6 + 1;
      lVar7 = lVar7 + 0x10;
    } while (lVar6 < pSVar3->_ndefaultparams);
  }
  return;
}

Assistant:

void Finalize(){
        SQFunctionProto *f = _function;
        _NULL_SQOBJECT_VECTOR(_outervalues,f->_noutervalues);
        _NULL_SQOBJECT_VECTOR(_defaultparams,f->_ndefaultparams);
    }